

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

OneWayPipe * __thiscall
kj::anon_unknown_0::AsyncIoProviderImpl::newOneWayPipe
          (OneWayPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_38;
  Fault f;
  SyscallResult local_24;
  undefined1 local_20 [4];
  SyscallResult _kjSyscallResult;
  int fds [2];
  AsyncIoProviderImpl *this_local;
  
  memset(local_20,0,8);
  f.exception = (Exception *)local_20;
  local_24 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncIoProviderImpl::newOneWayPipe()::_lambda()_1_>
                       ((anon_class_8_1_ba1d46d5 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_24);
  if (pvVar1 != (void *)0x0) {
    (**this->lowLevel->_vptr_LowLevelAsyncIoProvider)
              (__return_storage_ptr__,this->lowLevel,(ulong)(uint)local_20);
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[1])
              (&__return_storage_ptr__->out,this->lowLevel,(ulong)(uint)_kjSyscallResult.errorNumber
               ,7);
    return __return_storage_ptr__;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_24);
  kj::_::Debug::Fault::Fault
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x7b1,osErrorNumber,"pipe2(fds, O_NONBLOCK | O_CLOEXEC)","");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

OneWayPipe newOneWayPipe() override {
    int fds[2]{};
#if __linux__ && !__BIONIC__
    KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
    KJ_SYSCALL(pipe(fds));
#endif
    return OneWayPipe {
      lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapOutputFd(fds[1], NEW_FD_FLAGS)
    };
  }